

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::writePartitionDescriptor(IsoWriter *this)

{
  uint32_t tagLocation;
  char *pcVar1;
  uint uVar2;
  uint16_t *buff16;
  uint32_t *buff32;
  IsoWriter *this_local;
  size_t __n;
  
  memset(this->m_buffer,0,0x800);
  tagLocation = absoluteSectorNum(this);
  anon_unknown.dwarf_b4dde::writeDescriptorTag(this->m_buffer,Partition,tagLocation);
  this->m_buffer[0x10] = '\x02';
  this->m_buffer[0x11] = '\0';
  this->m_buffer[0x12] = '\0';
  this->m_buffer[0x13] = '\0';
  this->m_buffer[0x14] = '\x01';
  this->m_buffer[0x15] = '\0';
  this->m_buffer[0x16] = '\0';
  this->m_buffer[0x17] = '\0';
  strcpy((char *)(this->m_buffer + 0x19),"+NSR03");
  this->m_buffer[0xb8] = '\x01';
  this->m_buffer[0xb9] = '\0';
  this->m_buffer[0xba] = '\0';
  this->m_buffer[0xbb] = '\0';
  *(int *)(this->m_buffer + 0xbc) = this->m_partitionStartAddress;
  uVar2 = this->m_partitionEndAddress - this->m_partitionStartAddress;
  __n = (size_t)uVar2;
  *(uint *)(this->m_buffer + 0xc0) = uVar2;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)(this->m_buffer + 0xc5),pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)(this->m_buffer + 0xe4),pcVar1);
  anon_unknown.dwarf_b4dde::calcDescriptorCRC(this->m_buffer,0x200);
  File::write(&this->m_file,(int)this + 0xa0,(void *)0x800,__n);
  return;
}

Assistant:

void IsoWriter::writePartitionDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::Partition, absoluteSectorNum());

    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);
    const auto buff16 = reinterpret_cast<uint16_t *>(m_buffer);
    buff32[4] = 0x02;                                           // Descriptor Sequence Number
    buff16[10] = 0x01;                                          // partition flags
    buff16[11] = 0x00;                                          // Partition Number
    strcpy(reinterpret_cast<char *>(m_buffer) + 25, "+NSR03");  // Partition Contents
    // skip Partition Header Descriptor (all zero)
    buff32[184 / 4] = 0x01;                                             // Access Type
    buff32[188 / 4] = m_partitionStartAddress;                          // Partition Starting Location (576K address )
    buff32[192 / 4] = m_partitionEndAddress - m_partitionStartAddress;  // Partition Length field

    strcpy(reinterpret_cast<char *>(m_buffer) + 0xc5, m_impId.c_str());  // ImplementationID
    strcpy(reinterpret_cast<char *>(m_buffer) + 0xe4, m_appId.c_str());  // ImplementationUse

    calcDescriptorCRC(m_buffer, 512);
    m_file.write(m_buffer, SECTOR_SIZE);
}